

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_rope_f32(ggml_compute_params *params,ggml_tensor *dst,bool forward)

{
  long lVar1;
  float *cache;
  float ext_factor;
  float freq_scale;
  float fVar2;
  int32_t iVar3;
  float mscale;
  int32_t iVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  undefined4 uVar8;
  int iVar9;
  int32_t iVar10;
  uint uVar11;
  int iVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *pgVar14;
  ggml_tensor *pgVar15;
  long ne0;
  long lVar16;
  long lVar17;
  long lVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  void *pvVar23;
  void *pvVar24;
  void *pvVar25;
  undefined1 auVar26 [16];
  int iVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  char *pcVar33;
  int iVar34;
  undefined8 *puVar35;
  undefined4 *puVar36;
  undefined8 uVar37;
  long lVar38;
  void *pvVar39;
  undefined4 *puVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float theta_scale;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float corr_dims [2];
  int sections [4];
  long local_208;
  long local_200;
  long local_1e8;
  float *local_1c0;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  float local_e0 [2];
  undefined8 local_d8;
  undefined8 uStack_d0;
  size_t local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  size_t local_68;
  long local_60;
  long local_58;
  size_t local_50;
  undefined1 local_48 [16];
  
  ext_factor = (float)dst->op_params[7];
  freq_scale = (float)dst->op_params[6];
  pgVar13 = dst->src[1];
  pgVar14 = dst->src[0];
  fVar2 = (float)dst->op_params[5];
  pgVar15 = dst->src[2];
  iVar9 = dst->op_params[1];
  uVar48 = (ulong)iVar9;
  iVar10 = dst->op_params[4];
  uVar11 = dst->op_params[2];
  iVar3 = dst->op_params[9];
  mscale = (float)dst->op_params[8];
  local_d8 = *(undefined8 *)(dst->op_params + 0xb);
  uStack_d0 = *(undefined8 *)(dst->op_params + 0xd);
  iVar4 = dst->op_params[10];
  if (pgVar14->nb[0] == 4) {
    local_50 = pgVar14->nb[1];
    local_68 = pgVar14->nb[2];
    local_c0 = pgVar14->nb[3];
    ne0 = dst->ne[0];
    iVar12 = params->ith;
    iVar28 = params->nth;
    lVar16 = dst->ne[1];
    lVar17 = dst->ne[2];
    lVar18 = dst->ne[3];
    sVar19 = dst->nb[0];
    sVar20 = dst->nb[1];
    sVar21 = dst->nb[2];
    sVar22 = dst->nb[3];
    iVar27 = ggml_nrows(dst);
    if (ne0 < (long)uVar48) {
      pcVar33 = "n_dims <= ne0";
      uVar37 = 0x1406;
    }
    else if ((uVar48 & 1) == 0) {
      iVar28 = (iVar28 + -1 + iVar27) / iVar28;
      iVar34 = iVar28 * iVar12;
      iVar28 = iVar28 + iVar34;
      if (iVar27 <= iVar28) {
        iVar28 = iVar27;
      }
      theta_scale = powf(fVar2,-2.0 / (float)iVar9);
      ggml_rope_yarn_corr_dims(fVar2,iVar3,iVar4,iVar9,iVar10,local_e0);
      if (((((uVar11 & 8) == 0) || (0 < (int)local_d8)) || (0 < local_d8._4_4_)) ||
         (0 < (int)uStack_d0)) {
        if ((uVar11 == 0x18) && (ne0 / 2 != uVar48)) {
          pcVar33 = "n_dims == ne0/2";
          uVar37 = 0x1421;
        }
        else {
          if (pgVar15 == (ggml_tensor *)0x0) {
            local_1c0 = (float *)0x0;
LAB_0013f4ee:
            if (0 < lVar18) {
              local_120 = uVar48 * 4 + 4;
              local_150 = 0;
              local_190 = 0;
              iVar27 = 0;
              local_1e8 = 0;
              local_188 = (long)(iVar9 >> 1) << 2;
              pvVar23 = pgVar13->data;
              local_70 = (ne0 + 0x10) * (long)iVar12;
              local_88 = lVar17 * 0xc;
              local_178 = 4;
              local_78 = local_70 * 4 + 4;
              local_138 = uVar48 * 4;
              local_80 = local_138 + 4 + local_70 * 4;
              local_118 = uVar48 * 2;
              local_110 = uVar48 * 6;
              local_48 = ZEXT416((uint)forward * 0x3f800000 + (uint)!forward * -0x40800000);
              local_128 = sVar19 * uVar48 + 4;
              local_180 = local_138;
              local_170 = local_188;
              do {
                local_b8 = local_150;
                local_b0 = local_110;
                local_a8 = local_118;
                local_a0 = local_120;
                local_98 = local_128;
                local_90 = local_138;
                if (0 < lVar17) {
                  lVar32 = 0;
                  local_60 = local_1e8 * sVar22;
                  local_130 = local_178;
                  local_140 = local_180;
                  local_148 = local_170;
                  local_158 = local_188;
                  local_160 = local_190;
                  do {
                    pvVar24 = params->wdata;
                    cache = (float *)((long)pvVar24 + local_70 * 4);
                    iVar12 = *(int *)((long)pvVar23 + lVar32 * 4);
                    if ((uVar11 & 8) == 0) {
                      ggml_rope_cache_init
                                ((float)iVar12,freq_scale,local_1c0,local_e0,ne0,ext_factor,mscale,
                                 cache,local_48._0_4_,theta_scale);
                    }
                    else {
                      ggml_mrope_cache_init
                                ((float)iVar12,
                                 (float)*(int *)((long)pvVar23 + lVar17 * 4 + lVar32 * 4),
                                 (float)*(int *)((long)pvVar23 + lVar17 * 8 + lVar32 * 4),
                                 (float)*(int *)((long)pvVar23 + local_88 + lVar32 * 4),
                                 (int *)&local_d8,uVar11 == 0x18,freq_scale,local_1c0,local_e0,ne0,
                                 ext_factor,mscale,cache,local_48._0_4_,theta_scale);
                    }
                    auVar26 = _DAT_00155a80;
                    if (0 < lVar16) {
                      lVar38 = 0;
                      local_58 = lVar32 * sVar21;
                      local_208 = local_118;
                      local_200 = local_110;
                      local_f0 = local_128;
                      local_e8 = local_120;
                      iVar29 = iVar27 + (int)lVar16;
                      local_100 = local_138;
                      local_f8 = local_130;
                      lVar30 = local_148;
                      lVar31 = local_140;
                      lVar45 = local_158;
                      lVar46 = local_160;
                      lVar47 = local_150;
                      iVar12 = iVar27;
                      do {
                        if (iVar34 <= iVar12) {
                          iVar27 = iVar12 + 1;
                          if (iVar28 <= iVar12) break;
                          if ((uVar11 & 10) == 0) {
                            if (0 < iVar9) {
                              lVar41 = 0;
                              pvVar25 = pgVar14->data;
                              puVar35 = (undefined8 *)((long)dst->data + lVar46);
                              do {
                                uVar7 = *(uint *)((long)pvVar25 + lVar41 * 4 + local_f8);
                                auVar52._8_8_ = 0;
                                auVar52._0_8_ = *(ulong *)(cache + lVar41);
                                auVar49._0_4_ = uVar7 ^ 0x80000000;
                                auVar49._4_4_ = 0x80000000;
                                auVar49._8_4_ = 0x80000000;
                                auVar49._12_4_ = 0x80000000;
                                auVar49 = vpermt2ps_avx512vl(ZEXT416(uVar7),auVar26,auVar49);
                                auVar50 = vshufps_avx(auVar52,auVar52,0xe1);
                                auVar51._0_4_ = auVar50._0_4_ * auVar49._0_4_;
                                auVar51._4_4_ = auVar50._4_4_ * auVar49._4_4_;
                                auVar51._8_4_ = auVar50._8_4_ * auVar49._8_4_;
                                auVar51._12_4_ = auVar50._12_4_ * auVar49._12_4_;
                                uVar8 = *(undefined4 *)((long)pvVar25 + lVar41 * 4 + local_f8 + -4);
                                auVar50._4_4_ = uVar8;
                                auVar50._0_4_ = uVar8;
                                auVar50._8_4_ = uVar8;
                                auVar50._12_4_ = uVar8;
                                auVar50 = vfmadd231ps_avx512vl(auVar51,auVar52,auVar50);
                                lVar41 = lVar41 + 2;
                                uVar37 = vmovlps_avx(auVar50);
                                *puVar35 = uVar37;
                                puVar35 = (undefined8 *)((long)puVar35 + sVar19 * 2);
                              } while (lVar41 < (long)uVar48);
                            }
LAB_0013fa85:
                            if (uVar11 != 0x18) {
LAB_0013fb40:
                              if ((long)uVar48 < ne0) {
                                puVar36 = (undefined4 *)((long)dst->data + local_f0);
                                puVar40 = (undefined4 *)((long)pgVar14->data + local_e8);
                                uVar43 = uVar48;
                                do {
                                  uVar43 = uVar43 + 2;
                                  puVar36[-1] = puVar40[-1];
                                  uVar8 = *puVar40;
                                  puVar40 = puVar40 + 2;
                                  *puVar36 = uVar8;
                                  puVar36 = (undefined4 *)((long)puVar36 + sVar19 * 2);
                                } while ((long)uVar43 < ne0);
                              }
                              goto LAB_0013f8a5;
                            }
                          }
                          else {
                            if (uVar11 != 0x18) {
                              if (0 < iVar9) {
                                lVar41 = 0;
                                pvVar25 = pgVar14->data;
                                pvVar39 = dst->data;
                                do {
                                  fVar2 = *(float *)((long)pvVar24 + lVar41 * 4 + local_78);
                                  fVar5 = *(float *)((long)pvVar25 + lVar41 * 2 + lVar30);
                                  fVar6 = *(float *)((long)pvVar24 + lVar41 * 4 + local_78 + -4);
                                  lVar42 = lVar41 * 2;
                                  lVar41 = lVar41 + 2;
                                  auVar50 = ZEXT416(*(uint *)((long)pvVar25 + lVar42 + lVar47));
                                  auVar49 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar5)),auVar50,
                                                            ZEXT416((uint)fVar6));
                                  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar5)),auVar50,
                                                            ZEXT416((uint)fVar2));
                                  *(int *)((long)pvVar39 + lVar46) = auVar49._0_4_;
                                  *(int *)((long)pvVar39 + lVar45) = auVar50._0_4_;
                                  pvVar39 = (void *)((long)pvVar39 + sVar19);
                                } while (lVar41 < (long)uVar48);
                                goto LAB_0013fa85;
                              }
                              goto LAB_0013fb40;
                            }
                            if (0 < iVar9) {
                              lVar41 = 0;
                              pvVar25 = pgVar14->data;
                              pvVar39 = dst->data;
                              do {
                                fVar2 = *(float *)((long)pvVar24 + lVar41 * 4 + local_78);
                                fVar5 = *(float *)((long)pvVar25 + lVar41 * 2 + local_100);
                                fVar6 = *(float *)((long)pvVar24 + lVar41 * 4 + local_78 + -4);
                                lVar42 = lVar41 * 2;
                                lVar41 = lVar41 + 2;
                                auVar50 = ZEXT416(*(uint *)((long)pvVar25 + lVar42 + lVar47));
                                auVar49 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar5)),auVar50,
                                                          ZEXT416((uint)fVar6));
                                auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar5)),auVar50,
                                                          ZEXT416((uint)fVar2));
                                *(int *)((long)pvVar39 + lVar46) = auVar49._0_4_;
                                *(int *)((long)pvVar39 + lVar31) = auVar50._0_4_;
                                pvVar39 = (void *)((long)pvVar39 + sVar19);
                              } while (lVar41 < (long)uVar48);
                              goto LAB_0013fa85;
                            }
                          }
                          if ((long)uVar48 < ne0) {
                            lVar42 = 0;
                            pvVar25 = dst->data;
                            pvVar39 = pgVar14->data;
                            lVar41 = lVar38 * sVar20 + local_58 + local_60;
                            do {
                              fVar2 = *(float *)((long)pvVar24 + lVar42 * 4 + local_80);
                              fVar5 = *(float *)((long)pvVar39 + lVar42 * 2 + local_200);
                              fVar6 = *(float *)((long)pvVar24 + lVar42 * 4 + local_80 + -4);
                              lVar44 = ((long)(uVar48 + lVar42) >> 1) * sVar19;
                              auVar50 = ZEXT416(*(uint *)((long)pvVar39 + lVar42 * 2 + local_208));
                              auVar49 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar5)),auVar50,
                                                        ZEXT416((uint)fVar6));
                              auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar5)),auVar50,
                                                        ZEXT416((uint)fVar2));
                              *(int *)((long)pvVar25 + lVar44 + lVar41) = auVar49._0_4_;
                              lVar1 = uVar48 + 2 + lVar42;
                              lVar42 = lVar42 + 2;
                              *(int *)((long)pvVar25 + uVar48 * 4 + lVar44 + lVar41) = auVar50._0_4_
                              ;
                            } while (lVar1 < ne0);
                          }
                        }
LAB_0013f8a5:
                        lVar38 = lVar38 + 1;
                        local_100 = local_100 + local_50;
                        local_f8 = local_f8 + local_50;
                        local_f0 = local_f0 + sVar20;
                        local_e8 = local_e8 + local_50;
                        local_208 = local_208 + local_50;
                        local_200 = local_200 + local_50;
                        lVar46 = lVar46 + sVar20;
                        lVar45 = lVar45 + sVar20;
                        lVar47 = lVar47 + local_50;
                        lVar30 = lVar30 + local_50;
                        lVar31 = lVar31 + sVar20;
                        iVar12 = iVar12 + 1;
                        iVar27 = iVar29;
                      } while (lVar38 != lVar16);
                    }
                    local_160 = local_160 + sVar21;
                    local_158 = local_158 + sVar21;
                    local_140 = local_140 + sVar21;
                    local_128 = local_128 + sVar21;
                    local_150 = local_150 + local_68;
                    local_148 = local_148 + local_68;
                    local_138 = local_138 + local_68;
                    local_130 = local_130 + local_68;
                    local_120 = local_120 + local_68;
                    local_118 = local_118 + local_68;
                    local_110 = local_110 + local_68;
                    lVar32 = lVar32 + 1;
                  } while (lVar32 != lVar17);
                }
                local_190 = local_190 + sVar22;
                local_188 = local_188 + sVar22;
                local_180 = local_180 + sVar22;
                local_128 = local_98 + sVar22;
                local_170 = local_170 + local_c0;
                local_178 = local_178 + local_c0;
                local_1e8 = local_1e8 + 1;
                local_150 = local_b8 + local_c0;
                local_138 = local_90 + local_c0;
                local_120 = local_a0 + local_c0;
                local_110 = local_b0 + local_c0;
                local_118 = local_a8 + local_c0;
              } while (local_1e8 != lVar18);
            }
            return;
          }
          if (pgVar15->type == GGML_TYPE_F32) {
            if ((long)(iVar9 >> 1) <= pgVar15->ne[0]) {
              local_1c0 = (float *)pgVar15->data;
              goto LAB_0013f4ee;
            }
            pcVar33 = "src2->ne[0] >= n_dims / 2";
            uVar37 = 0x1427;
          }
          else {
            pcVar33 = "src2->type == GGML_TYPE_F32";
            uVar37 = 0x1426;
          }
        }
      }
      else {
        pcVar33 = "sections[0] > 0 || sections[1] > 0 || sections[2] > 0";
        uVar37 = 0x141d;
      }
    }
    else {
      pcVar33 = "n_dims % 2 == 0";
      uVar37 = 0x1407;
    }
  }
  else {
    pcVar33 = "nb00 == sizeof(float)";
    uVar37 = 0x13ff;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar37,"GGML_ASSERT(%s) failed",pcVar33);
}

Assistant:

static void ggml_compute_forward_rope_f32(
        const ggml_compute_params * params,
        ggml_tensor * dst,
        const bool forward) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];
    const ggml_tensor * src2 = dst->src[2];

    float freq_base, freq_scale, ext_factor, attn_factor, beta_fast, beta_slow;
    int sections[4];

    //const int n_past     = ((int32_t *) dst->op_params)[0];
    const int n_dims     = ((int32_t *) dst->op_params)[1];
    const int mode       = ((int32_t *) dst->op_params)[2];
    //const int n_ctx      = ((int32_t *) dst->op_params)[3];
    const int n_ctx_orig = ((int32_t *) dst->op_params)[4];

    memcpy(&freq_base,   (int32_t *) dst->op_params +  5, sizeof(float));
    memcpy(&freq_scale,  (int32_t *) dst->op_params +  6, sizeof(float));
    memcpy(&ext_factor,  (int32_t *) dst->op_params +  7, sizeof(float));
    memcpy(&attn_factor, (int32_t *) dst->op_params +  8, sizeof(float));
    memcpy(&beta_fast,   (int32_t *) dst->op_params +  9, sizeof(float));
    memcpy(&beta_slow,   (int32_t *) dst->op_params + 10, sizeof(float));
    memcpy(&sections,    (int32_t *) dst->op_params + 11, sizeof(int)*4);

    GGML_TENSOR_UNARY_OP_LOCALS

    //printf("ne0: %d, ne1: %d, ne2: %d, ne3: %d\n", ne0, ne1, ne2, ne3);
    //printf("n_past = %d, ne2 = %d\n", n_past, ne2);

    GGML_ASSERT(nb00 == sizeof(float));

    const int ith = params->ith;
    const int nth = params->nth;

    const int nr = ggml_nrows(dst);

    GGML_ASSERT(n_dims <= ne0);
    GGML_ASSERT(n_dims % 2 == 0);

    // rows per thread
    const int dr = (nr + nth - 1)/nth;

    // row range for this thread
    const int ir0 = dr*ith;
    const int ir1 = MIN(ir0 + dr, nr);

    // row index used to determine which thread to use
    int ir = 0;

    const float theta_scale = powf(freq_base, -2.0f/n_dims);

    float corr_dims[2];
    ggml_rope_yarn_corr_dims(n_dims, n_ctx_orig, freq_base, beta_fast, beta_slow, corr_dims);

    const bool is_neox = mode & GGML_ROPE_TYPE_NEOX;
    const bool is_mrope = mode & GGML_ROPE_TYPE_MROPE;  // ggml_rope_multi, multimodal rotary position embedding
    const bool is_vision = mode == GGML_ROPE_TYPE_VISION;

    if (is_mrope) {
        GGML_ASSERT(sections[0] > 0 || sections[1] > 0 || sections[2] > 0);
    }

    if (is_vision) {
        GGML_ASSERT(n_dims == ne0/2);
    }

    const float * freq_factors = NULL;
    if (src2 != NULL) {
        GGML_ASSERT(src2->type == GGML_TYPE_F32);
        GGML_ASSERT(src2->ne[0] >= n_dims / 2);
        freq_factors = (const float *) src2->data;
    }

    // backward process uses inverse rotation by cos and sin.
    // cos and sin build a rotation matrix, where the inverse is the transpose.
    // this essentially just switches the sign of sin.
    const float sin_sign = forward ? 1.0f : -1.0f;

    const int32_t * pos = (const int32_t *) src1->data;

    for (int64_t i3 = 0; i3 < ne3; i3++) { // batch
        for (int64_t i2 = 0; i2 < ne2; i2++) { // seq-len

            float * cache = (float *) params->wdata + (ne0 + CACHE_LINE_SIZE_F32)*ith;
            if (!is_mrope) {
                const int64_t p = pos[i2];
                ggml_rope_cache_init(p, freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }
            else {
                const int64_t p_t = pos[i2];
                const int64_t p_h = pos[i2 + ne2];
                const int64_t p_w = pos[i2 + ne2 * 2];
                const int64_t p_e = pos[i2 + ne2 * 3];
                ggml_mrope_cache_init(
                    p_t, p_h, p_w, p_e, sections, is_vision,
                    freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }

            for (int64_t i1 = 0; i1 < ne1; i1++) { // attn-heads
                if (ir++ < ir0) continue;
                if (ir   > ir1) break;

                if (is_neox || is_mrope) {
                    if (is_vision){
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = src[0];
                            const float x1 = src[n_dims];

                            dst_data[0]      = x0*cos_theta - x1*sin_theta;
                            dst_data[n_dims] = x0*sin_theta + x1*cos_theta;
                        }
                    } else {
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = src[0];
                            const float x1 = src[n_dims/2];

                            dst_data[0]        = x0*cos_theta - x1*sin_theta;
                            dst_data[n_dims/2] = x0*sin_theta + x1*cos_theta;
                        }
                    }
                } else {
                    for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                              float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        const float x0 = src[0];
                        const float x1 = src[1];

                        dst_data[0] = x0*cos_theta - x1*sin_theta;
                        dst_data[1] = x0*sin_theta + x1*cos_theta;
                    }
                }

                if (is_vision) {
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const int64_t ic = i0/2;

                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                        float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                        const float x0 = src[0];
                        const float x1 = src[n_dims];

                        dst_data[0]      = x0*cos_theta - x1*sin_theta;
                        dst_data[n_dims] = x0*sin_theta + x1*cos_theta;
                    }
                } else {
                    // fill the remain channels with data from src tensor
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                        float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        dst_data[0] = src[0];
                        dst_data[1] = src[1];
                    }
                }
            }
        }
    }
}